

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O2

int __thiscall
EnvironmentNAVXYTHETALATTICE::GetActionCost
          (EnvironmentNAVXYTHETALATTICE *this,int SourceX,int SourceY,int SourceTheta,
          EnvNAVXYTHETALATAction_t *action)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  reference pvVar4;
  reference pvVar5;
  uchar **ppuVar6;
  uint uVar7;
  size_type sVar8;
  uint uVar9;
  uint uVar10;
  byte bVar11;
  
  iVar2 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x41])();
  if ((char)iVar2 == '\0') {
    return 1000000000;
  }
  iVar2 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x41])
                    (this,(ulong)(uint)(action->dX + SourceX),(ulong)(uint)(action->dY + SourceY));
  if ((char)iVar2 == '\0') {
    return 1000000000;
  }
  ppuVar6 = (this->EnvNAVXYTHETALATCfg).Grid2D;
  if ((this->EnvNAVXYTHETALATCfg).cost_inscribed_thresh <=
      ppuVar6[(long)action->dX + (long)SourceX][(long)action->dY + (long)SourceY]) {
    return 1000000000;
  }
  sVar8 = 0;
  uVar9 = 0;
  while( true ) {
    bVar11 = (byte)uVar9;
    if ((long)(int)(((long)(action->interm3DcellsV).
                           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(action->interm3DcellsV).
                          super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc) <= (long)sVar8) {
      if ((0x10 < (ulong)((long)(this->EnvNAVXYTHETALATCfg).FootprintPolygon.
                                super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->EnvNAVXYTHETALATCfg).FootprintPolygon.
                               super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl
                               .super__Vector_impl_data._M_start)) &&
         ((this->EnvNAVXYTHETALATCfg).cost_possibly_circumscribed_thresh <= (int)uVar9)) {
        checks = checks + 1;
        sVar8 = 0;
        while ((long)sVar8 <
               (long)(int)((ulong)((long)(action->intersectingcellsV).
                                         super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(action->intersectingcellsV).
                                        super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
          pvVar5 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::at
                             (&action->intersectingcellsV,sVar8);
          iVar2 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x41])
                            (this,(ulong)(uint)((*pvVar5).x + SourceX),
                             (ulong)(uint)((*pvVar5).y + SourceY));
          sVar8 = sVar8 + 1;
          if ((char)iVar2 == '\0') {
            return 1000000000;
          }
        }
        ppuVar6 = (this->EnvNAVXYTHETALATCfg).Grid2D;
      }
      bVar1 = ppuVar6[SourceX][SourceY];
      if (ppuVar6[SourceX][SourceY] < bVar11) {
        bVar1 = bVar11;
      }
      if (bVar1 <= ppuVar6[(long)action->dX + (long)SourceX][(long)action->dY + (long)SourceY]) {
        bVar1 = ppuVar6[(long)action->dX + (long)SourceX][(long)action->dY + (long)SourceY];
      }
      return (bVar1 + 1) * action->cost;
    }
    pvVar4 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::at
                       (&action->interm3DcellsV,sVar8);
    uVar7 = pvVar4->x + SourceX;
    if ((int)uVar7 < 0) {
      return 1000000000;
    }
    if ((this->EnvNAVXYTHETALATCfg).EnvWidth_c <= (int)uVar7) break;
    uVar3 = pvVar4->y + SourceY;
    if ((int)uVar3 < 0) {
      return 1000000000;
    }
    if ((this->EnvNAVXYTHETALATCfg).EnvHeight_c <= (int)uVar3) {
      return 1000000000;
    }
    ppuVar6 = (this->EnvNAVXYTHETALATCfg).Grid2D;
    uVar10 = (uint)ppuVar6[uVar7][uVar3];
    if (ppuVar6[uVar7][uVar3] < bVar11) {
      uVar10 = uVar9;
    }
    sVar8 = sVar8 + 1;
    uVar9 = uVar10;
    if ((this->EnvNAVXYTHETALATCfg).cost_inscribed_thresh <= (byte)uVar10) {
      return 1000000000;
    }
  }
  return 1000000000;
}

Assistant:

int EnvironmentNAVXYTHETALATTICE::GetActionCost(
    int SourceX, int SourceY, int SourceTheta,
    EnvNAVXYTHETALATAction_t* action)
{
    sbpl_2Dcell_t cell;
    sbpl_xy_theta_cell_t interm3Dcell;
    int i;

    // TODO - go over bounding box (minpt and maxpt) to test validity and skip
    // testing boundaries below, also order intersect cells so that the four
    // farthest pts go first

    if (!IsValidCell(SourceX, SourceY)) {
        return INFINITECOST;
    }
    if (!IsValidCell(SourceX + action->dX, SourceY + action->dY)) {
        return INFINITECOST;
    }

    if (EnvNAVXYTHETALATCfg.Grid2D[SourceX + action->dX][SourceY + action->dY] >=
        EnvNAVXYTHETALATCfg.cost_inscribed_thresh)
    {
        return INFINITECOST;
    }

    // need to iterate over discretized center cells and compute cost based on them
    unsigned char maxcellcost = 0;
    for (i = 0; i < (int)action->interm3DcellsV.size(); i++) {
        interm3Dcell = action->interm3DcellsV.at(i);
        interm3Dcell.x = interm3Dcell.x + SourceX;
        interm3Dcell.y = interm3Dcell.y + SourceY;

        if (interm3Dcell.x < 0 || interm3Dcell.x >= EnvNAVXYTHETALATCfg.EnvWidth_c ||
            interm3Dcell.y < 0 || interm3Dcell.y >= EnvNAVXYTHETALATCfg.EnvHeight_c)
        {
            return INFINITECOST;
        }

        maxcellcost = __max(maxcellcost, EnvNAVXYTHETALATCfg.Grid2D[interm3Dcell.x][interm3Dcell.y]);

        // check that the robot is NOT in the cell at which there is no valid orientation
        if (maxcellcost >= EnvNAVXYTHETALATCfg.cost_inscribed_thresh) {
            return INFINITECOST;
        }
    }

    // check collisions that for the particular footprint orientation along the action
    if (EnvNAVXYTHETALATCfg.FootprintPolygon.size() > 1 &&
        (int)maxcellcost >= EnvNAVXYTHETALATCfg.cost_possibly_circumscribed_thresh)
    {
        checks++;

        for (i = 0; i < (int)action->intersectingcellsV.size(); i++) {
            // get the cell in the map
            cell = action->intersectingcellsV.at(i);
            cell.x = cell.x + SourceX;
            cell.y = cell.y + SourceY;

            // check validity
            if (!IsValidCell(cell.x, cell.y)) {
                return INFINITECOST;
            }

// cost computation changed: cost = max(cost of centers of the robot along
// action) intersecting cells are only used for collision checking
//            if (EnvNAVXYTHETALATCfg.Grid2D[cell.x][cell.y] > currentmaxcost) {
//              currentmaxcost = EnvNAVXYTHETALATCfg.Grid2D[cell.x][cell.y];
//            }
        }
    }

    // to ensure consistency of h2D:
    maxcellcost = __max(maxcellcost, EnvNAVXYTHETALATCfg.Grid2D[SourceX][SourceY]);
    int currentmaxcost = (int)__max(
            maxcellcost,
            EnvNAVXYTHETALATCfg.Grid2D[SourceX + action->dX][SourceY + action->dY]);

    // use cell cost as multiplicative factor
    return action->cost * (currentmaxcost + 1);
}